

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.h
# Opt level: O0

void __thiscall sptk::SymmetricMatrix::~SymmetricMatrix(SymmetricMatrix *this)

{
  undefined8 *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  *in_RDI = &PTR__SymmetricMatrix_00125d58;
  std::vector<double_*,_std::allocator<double_*>_>::~vector
            ((vector<double_*,_std::allocator<double_*>_> *)unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

virtual ~SymmetricMatrix() {
  }